

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx512f.hpp
# Opt level: O0

float xsimd::kernel::reduce_add<xsimd::avx512bw>
                (batch<float,_xsimd::avx512bw> *rhs,requires_arch<avx512f> param_2)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  simd_register *in_RSI;
  register_type *in_RDI;
  float fVar10;
  undefined8 in_XMM0_Qa;
  float fVar12;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar11 [64];
  register_type reg;
  __m128 res3;
  __m128 res2;
  __m128 res1;
  __m128 tmp4;
  __m128 tmp3;
  __m128 tmp2;
  __m128 tmp1;
  sse3 local_141;
  batch<float,_xsimd::sse4_2> local_140;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  undefined8 uStack_c8;
  register_type *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_b8 = in_RDI;
  types::simd_register::operator_cast_to_function_pointer(in_RDI,in_RSI);
  local_d0 = in_XMM0_Qa;
  uStack_c8 = in_XMM0_Qb;
  types::simd_register::operator_cast_to_function_pointer(local_b8,in_RSI);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  local_e0 = auVar1._16_16_;
  auVar11 = ZEXT1664(local_e0);
  types::simd_register::operator_cast_to_function_pointer(local_b8,in_RSI);
  local_f0 = vextractf32x4_avx512f(auVar11,2);
  auVar11 = ZEXT1664(local_f0);
  types::simd_register::operator_cast_to_function_pointer(local_b8,in_RSI);
  local_100 = vextractf32x4_avx512f(auVar11,3);
  local_60 = local_d0;
  uVar8 = local_60;
  uStack_58 = uStack_c8;
  uVar9 = uStack_58;
  local_70 = local_e0._0_8_;
  uVar6 = local_70;
  uStack_68 = local_e0._8_8_;
  uVar7 = uStack_68;
  local_60._0_4_ = (float)local_d0;
  local_60._4_4_ = (float)((ulong)local_d0 >> 0x20);
  uStack_58._0_4_ = (float)uStack_c8;
  uStack_58._4_4_ = (float)((ulong)uStack_c8 >> 0x20);
  local_70._0_4_ = local_e0._0_4_;
  local_70._4_4_ = local_e0._4_4_;
  uStack_68._0_4_ = local_e0._8_4_;
  uStack_68._4_4_ = local_e0._12_4_;
  local_60._0_4_ = (float)local_60 + (float)local_70;
  local_60._4_4_ = local_60._4_4_ + local_70._4_4_;
  local_110 = CONCAT44(local_60._4_4_,(float)local_60);
  uStack_108 = CONCAT44(uStack_58._4_4_ + uStack_68._4_4_,(float)uStack_58 + (float)uStack_68);
  local_80 = local_f0._0_8_;
  uVar4 = local_80;
  uStack_78 = local_f0._8_8_;
  uVar5 = uStack_78;
  local_90 = local_100._0_8_;
  uVar2 = local_90;
  uStack_88 = local_100._8_8_;
  uVar3 = uStack_88;
  local_80._0_4_ = local_f0._0_4_;
  local_80._4_4_ = local_f0._4_4_;
  uStack_78._0_4_ = local_f0._8_4_;
  uStack_78._4_4_ = local_f0._12_4_;
  local_90._0_4_ = local_100._0_4_;
  local_90._4_4_ = local_100._4_4_;
  uStack_88._0_4_ = local_100._8_4_;
  uStack_88._4_4_ = local_100._12_4_;
  local_120 = CONCAT44(local_80._4_4_ + local_90._4_4_,(float)local_80 + (float)local_90);
  uStack_118 = CONCAT44(uStack_78._4_4_ + uStack_88._4_4_,(float)uStack_78 + (float)uStack_88);
  fVar10 = (float)local_60 + (float)local_80 + (float)local_90;
  fVar12 = local_60._4_4_ + local_80._4_4_ + local_90._4_4_;
  local_130 = CONCAT44(fVar12,fVar10);
  uStack_128 = CONCAT44(uStack_58._4_4_ + uStack_68._4_4_ + uStack_78._4_4_ + uStack_88._4_4_,
                        (float)uStack_58 + (float)uStack_68 + (float)uStack_78 + (float)uStack_88);
  reg[2] = (float)local_60;
  reg[3] = local_60._4_4_;
  reg[0] = fVar10;
  reg[1] = fVar12;
  local_b0 = local_120;
  uStack_a8 = uStack_118;
  local_a0 = local_110;
  uStack_98 = uStack_108;
  local_90 = uVar2;
  uStack_88 = uVar3;
  local_80 = uVar4;
  uStack_78 = uVar5;
  local_70 = uVar6;
  uStack_68 = uVar7;
  local_60 = uVar8;
  uStack_58 = uVar9;
  batch<float,_xsimd::sse4_2>::batch(&local_140,reg);
  fVar10 = reduce_add<xsimd::sse4_2>(&local_140,&local_141);
  return fVar10;
}

Assistant:

inline float reduce_add(batch<float, A> const& rhs, requires_arch<avx512f>) noexcept
        {
            __m128 tmp1 = _mm512_extractf32x4_ps(rhs, 0);
            __m128 tmp2 = _mm512_extractf32x4_ps(rhs, 1);
            __m128 tmp3 = _mm512_extractf32x4_ps(rhs, 2);
            __m128 tmp4 = _mm512_extractf32x4_ps(rhs, 3);
            __m128 res1 = _mm_add_ps(tmp1, tmp2);
            __m128 res2 = _mm_add_ps(tmp3, tmp4);
            __m128 res3 = _mm_add_ps(res1, res2);
            return reduce_add(batch<float, sse4_2>(res3), sse4_2 {});
        }